

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::invalidTexCubeAttachmentTest(TestContext *testCtx,Context *context)

{
  uint local_1c;
  Context *pCStack_18;
  deUint32 texCube;
  Context *context_local;
  TestContext *testCtx_local;
  
  pCStack_18 = context;
  context_local = (Context *)testCtx;
  (*context->_vptr_Context[9])(context,0x8d40,1);
  logComment((TestContext *)context_local,
             "Attaching cube texture using GL_TEXTURE_2D texture target");
  local_1c = 2;
  (*pCStack_18->_vptr_Context[6])(pCStack_18,0x8513,2);
  (*pCStack_18->_vptr_Context[0x1e])(pCStack_18,0x8d40,0x8ce0,0xde1,(ulong)local_1c,0);
  checkError((TestContext *)context_local,pCStack_18,0x502);
  logComment((TestContext *)context_local,"Attaching deleted cube texture object");
  (*pCStack_18->_vptr_Context[8])(pCStack_18,1,&local_1c);
  (*pCStack_18->_vptr_Context[0x1e])(pCStack_18,0x8d40,0x8ce0,0x8515,(ulong)local_1c,0);
  checkError((TestContext *)context_local,pCStack_18,0x502);
  return;
}

Assistant:

static void invalidTexCubeAttachmentTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	logComment(testCtx, "Attaching cube texture using GL_TEXTURE_2D texture target");
	deUint32 texCube = 2;
	context.bindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texCube, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching deleted cube texture object");
	context.deleteTextures(1, &texCube);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}